

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::DynamicMapField::SyncMapWithRepeatedFieldNoLock(DynamicMapField *this)

{
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this_00;
  bool value;
  string sVar1;
  int iVar2;
  CppType CVar3;
  uint32 uVar4;
  int32 value_00;
  undefined4 extraout_var;
  FieldDescriptor *this_01;
  undefined4 extraout_var_00;
  FieldDescriptor *this_02;
  RepeatedPtrField<google::protobuf::Message> *pRVar5;
  LogMessage *other;
  uint64 uVar6;
  int64 value_01;
  MapValueRef *pMVar7;
  Message *pMVar8;
  undefined4 extraout_var_01;
  string *this_03;
  Rep *pRVar9;
  Reflection *this_04;
  void **ppvVar10;
  void **ppvVar11;
  float fVar12;
  double dVar13;
  iterator iter;
  MapKey map_key;
  iterator iter_1;
  
  (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x15])();
  iVar2 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x15])();
  std::__cxx11::string::string((string *)&iter,"key",(allocator *)&iter_1);
  this_01 = Descriptor::FindFieldByName((Descriptor *)CONCAT44(extraout_var,iVar2),(string *)&iter);
  std::__cxx11::string::~string((string *)&iter);
  iVar2 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x15])();
  std::__cxx11::string::string((string *)&iter,"value",(allocator *)&iter_1);
  this_02 = Descriptor::FindFieldByName
                      ((Descriptor *)CONCAT44(extraout_var_00,iVar2),(string *)&iter);
  this_00 = &this->map_;
  std::__cxx11::string::~string((string *)&iter.it_);
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::begin(&iter,this_00);
  while (iter.it_.node_ != (Node *)0x0) {
    MapValueRef::DeleteData(&(((iter.it_.node_)->kv).v_)->second);
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
    iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
    ::operator++(&iter.it_);
  }
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::clear(this_00);
  pRVar5 = (this->
           super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
           super_MapFieldBase.repeated_field_;
  pRVar9 = (pRVar5->super_RepeatedPtrFieldBase).rep_;
  ppvVar11 = pRVar9->elements;
  if (pRVar9 == (Rep *)0x0) {
    ppvVar11 = (void **)0x0;
  }
  do {
    ppvVar10 = pRVar9->elements;
    if (pRVar9 == (Rep *)0x0) {
      ppvVar10 = (void **)0x0;
    }
    if (ppvVar11 == ppvVar10 + (pRVar5->super_RepeatedPtrFieldBase).current_size_) {
      return;
    }
    map_key.type_ = 0;
    CVar3 = FieldDescriptor::cpp_type(this_01);
    switch(CVar3) {
    case CPPTYPE_INT32:
      value_00 = Reflection::GetInt32(this_04,(Message *)*ppvVar11,this_01);
      MapKey::SetInt32Value(&map_key,value_00);
      break;
    case CPPTYPE_INT64:
      value_01 = Reflection::GetInt64(this_04,(Message *)*ppvVar11,this_01);
      MapKey::SetInt64Value(&map_key,value_01);
      break;
    case CPPTYPE_UINT32:
      uVar4 = Reflection::GetUInt32(this_04,(Message *)*ppvVar11,this_01);
      MapKey::SetUInt32Value(&map_key,uVar4);
      break;
    case CPPTYPE_UINT64:
      uVar6 = Reflection::GetUInt64(this_04,(Message *)*ppvVar11,this_01);
      MapKey::SetUInt64Value(&map_key,uVar6);
      break;
    case CPPTYPE_DOUBLE:
    case CPPTYPE_FLOAT:
    case CPPTYPE_ENUM:
    case CPPTYPE_MESSAGE:
      LogMessage::LogMessage
                ((LogMessage *)&iter,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/map_field.cc"
                 ,0x1e4);
      other = LogMessage::operator<<((LogMessage *)&iter,"Can\'t get here.");
      LogFinisher::operator=((LogFinisher *)&iter_1,other);
      LogMessage::~LogMessage((LogMessage *)&iter);
      break;
    case CPPTYPE_BOOL:
      value = Reflection::GetBool(this_04,(Message *)*ppvVar11,this_01);
      MapKey::SetBoolValue(&map_key,value);
      break;
    case CPPTYPE_STRING:
      Reflection::GetString_abi_cxx11_((string *)&iter,this_04,(Message *)*ppvVar11,this_01);
      MapKey::SetStringValue(&map_key,(string *)&iter);
      std::__cxx11::string::~string((string *)&iter);
    }
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::find(&iter_1,this_00,&map_key);
    if (iter_1.it_.node_ != (Node *)0x0) {
      MapValueRef::DeleteData(&(((iter_1.it_.node_)->kv).v_)->second);
    }
    pMVar7 = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::operator[]
                       (this_00,&map_key);
    CVar3 = FieldDescriptor::cpp_type(this_02);
    pMVar7->type_ = CVar3;
    CVar3 = FieldDescriptor::cpp_type(this_02);
    switch(CVar3) {
    case CPPTYPE_INT32:
      this_03 = (string *)operator_new(4);
      uVar4 = Reflection::GetInt32(this_04,(Message *)*ppvVar11,this_02);
      goto LAB_00264531;
    case CPPTYPE_INT64:
      this_03 = (string *)operator_new(8);
      uVar6 = Reflection::GetInt64(this_04,(Message *)*ppvVar11,this_02);
      goto LAB_00264554;
    case CPPTYPE_UINT32:
      this_03 = (string *)operator_new(4);
      uVar4 = Reflection::GetUInt32(this_04,(Message *)*ppvVar11,this_02);
      goto LAB_00264531;
    case CPPTYPE_UINT64:
      this_03 = (string *)operator_new(8);
      uVar6 = Reflection::GetUInt64(this_04,(Message *)*ppvVar11,this_02);
LAB_00264554:
      *(uint64 *)this_03 = uVar6;
      break;
    case CPPTYPE_DOUBLE:
      this_03 = (string *)operator_new(8);
      dVar13 = Reflection::GetDouble(this_04,(Message *)*ppvVar11,this_02);
      *(double *)this_03 = dVar13;
      break;
    case CPPTYPE_FLOAT:
      this_03 = (string *)operator_new(4);
      fVar12 = Reflection::GetFloat(this_04,(Message *)*ppvVar11,this_02);
      *(float *)this_03 = fVar12;
      break;
    case CPPTYPE_BOOL:
      this_03 = (string *)operator_new(1);
      sVar1 = (string)Reflection::GetBool(this_04,(Message *)*ppvVar11,this_02);
      *this_03 = sVar1;
      break;
    case CPPTYPE_ENUM:
      this_03 = (string *)operator_new(4);
      uVar4 = Reflection::GetEnumValue(this_04,(Message *)*ppvVar11,this_02);
LAB_00264531:
      *(uint32 *)this_03 = uVar4;
      break;
    case CPPTYPE_STRING:
      this_03 = (string *)operator_new(0x20);
      *(string **)this_03 = this_03 + 0x10;
      *(undefined8 *)(this_03 + 8) = 0;
      this_03[0x10] = (string)0x0;
      Reflection::GetString_abi_cxx11_((string *)&iter,this_04,(Message *)*ppvVar11,this_02);
      std::__cxx11::string::operator=(this_03,(string *)&iter);
      std::__cxx11::string::~string((string *)&iter);
      break;
    case CPPTYPE_MESSAGE:
      pMVar8 = Reflection::GetMessage(this_04,(Message *)*ppvVar11,this_02,(MessageFactory *)0x0);
      iVar2 = (*(pMVar8->super_MessageLite)._vptr_MessageLite[3])(pMVar8);
      this_03 = (string *)CONCAT44(extraout_var_01,iVar2);
      (**(code **)(*(uint64 *)this_03 + 0x80))(this_03,pMVar8);
      break;
    default:
      goto switchD_00264460_default;
    }
    pMVar7->data_ = this_03;
switchD_00264460_default:
    MapKey::~MapKey(&map_key);
    ppvVar11 = ppvVar11 + 1;
    pRVar5 = (this->
             super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>)
             .super_MapFieldBase.repeated_field_;
    pRVar9 = (pRVar5->super_RepeatedPtrFieldBase).rep_;
  } while( true );
}

Assistant:

void DynamicMapField::SyncMapWithRepeatedFieldNoLock() const {
  Map<MapKey, MapValueRef>* map = &const_cast<DynamicMapField*>(this)->map_;
  const Reflection* reflection = default_entry_->GetReflection();
  const FieldDescriptor* key_des =
      default_entry_->GetDescriptor()->FindFieldByName("key");
  const FieldDescriptor* val_des =
      default_entry_->GetDescriptor()->FindFieldByName("value");
  // DynamicMapField owns map values. Need to delete them before clearing
  // the map.
  for (Map<MapKey, MapValueRef>::iterator iter = map->begin();
       iter != map->end(); ++iter) {
    iter->second.DeleteData();
  }
  map->clear();
  for (RepeatedPtrField<Message>::iterator it =
           MapFieldBase::repeated_field_->begin();
       it != MapFieldBase::repeated_field_->end(); ++it) {
    MapKey map_key;
    switch (key_des->cpp_type()) {
      case FieldDescriptor::CPPTYPE_STRING:
        map_key.SetStringValue(reflection->GetString(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_INT64:
        map_key.SetInt64Value(reflection->GetInt64(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_INT32:
        map_key.SetInt32Value(reflection->GetInt32(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_UINT64:
        map_key.SetUInt64Value(reflection->GetUInt64(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_UINT32:
        map_key.SetUInt32Value(reflection->GetUInt32(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_BOOL:
        map_key.SetBoolValue(reflection->GetBool(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_DOUBLE:
      case FieldDescriptor::CPPTYPE_FLOAT:
      case FieldDescriptor::CPPTYPE_ENUM:
      case FieldDescriptor::CPPTYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Can't get here.";
        break;
    }

    // Remove existing map value with same key.
    Map<MapKey, MapValueRef>::iterator iter = map->find(map_key);
    if (iter != map->end()) {
      iter->second.DeleteData();
    }

    MapValueRef& map_val = (*map)[map_key];
    map_val.SetType(val_des->cpp_type());
    switch (val_des->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, TYPE, METHOD)          \
  case FieldDescriptor::CPPTYPE_##CPPTYPE: {        \
    TYPE* value = new TYPE;                         \
    *value = reflection->Get##METHOD(*it, val_des); \
    map_val.SetValue(value);                        \
    break;                                          \
  }
      HANDLE_TYPE(INT32, int32, Int32);
      HANDLE_TYPE(INT64, int64, Int64);
      HANDLE_TYPE(UINT32, uint32, UInt32);
      HANDLE_TYPE(UINT64, uint64, UInt64);
      HANDLE_TYPE(DOUBLE, double, Double);
      HANDLE_TYPE(FLOAT, float, Float);
      HANDLE_TYPE(BOOL, bool, Bool);
      HANDLE_TYPE(STRING, std::string, String);
      HANDLE_TYPE(ENUM, int32, EnumValue);
#undef HANDLE_TYPE
      case FieldDescriptor::CPPTYPE_MESSAGE: {
        const Message& message = reflection->GetMessage(*it, val_des);
        Message* value = message.New();
        value->CopyFrom(message);
        map_val.SetValue(value);
        break;
      }
    }
  }
}